

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullstrcmp.c
# Opt level: O2

int nullstrcmp(char *a,char *b)

{
  int iVar1;
  
  iVar1 = 1;
  if (a == (char *)0x0) {
    iVar1 = (a == (char *)0x0 && b == (char *)0x0) - 1;
  }
  if (a == (char *)0x0 || b == (char *)0x0) {
    return iVar1;
  }
  iVar1 = strcmp(a,b);
  return iVar1;
}

Assistant:

int nullstrcmp(const char *a, const char *b)
{
    if (a == NULL && b == NULL)
        return 0;
    if (a == NULL)
        return -1;
    if (b == NULL)
        return +1;
    return strcmp(a, b);
}